

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

TValueCC calcCC<stSampleMulti<short,4>>
                   (TWaveformViewT<TSampleMI16> *waveform0,TWaveformViewT<TSampleMI16> *waveform1,
                   int64_t sum0,int64_t sum02)

{
  undefined4 uVar1;
  uint uVar2;
  short sVar3;
  undefined1 auVar4 [12];
  long lVar5;
  stSampleMulti<short,_4> *psVar6;
  stSampleMulti<short,_4> *psVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM6 [16];
  int iVar24;
  undefined1 in_XMM7 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar20 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  
  lVar5 = waveform0->n;
  if (waveform1->n < waveform0->n) {
    lVar5 = waveform1->n;
  }
  if (lVar5 < 1) {
    lVar11 = 0;
    lVar13 = 0;
    lVar15 = 0;
  }
  else {
    psVar7 = waveform0->samples;
    psVar6 = waveform1->samples;
    lVar15 = 0;
    lVar13 = 0;
    lVar11 = 0;
    lVar8 = 0;
    do {
      lVar16 = 0;
      lVar14 = 0;
      lVar12 = 0;
      lVar9 = 0;
      do {
        uVar1 = *(undefined4 *)((psVar7->super_array<short,_4UL>)._M_elems + lVar9);
        uVar2 = *(uint *)((psVar6->super_array<short,_4UL>)._M_elems + lVar9);
        auVar17 = ZEXT416(uVar2);
        in_XMM6 = pshuflw(in_XMM6,auVar17,0xd4);
        auVar22 = pshuflw(in_XMM7,auVar17,0x60);
        iVar24 = auVar22._0_4_ >> 0x10;
        auVar23._4_4_ = auVar22._4_4_ >> 0x10;
        auVar23._8_4_ = auVar23._4_4_;
        auVar23._12_4_ = -(uint)(auVar22._4_4_ < 0);
        lVar15 = lVar15 + CONCAT44(-(uint)(auVar22._0_4_ < 0),iVar24);
        lVar16 = lVar16 + auVar23._8_8_;
        in_XMM7 = pmulhw(auVar17,auVar17);
        sVar3 = (short)(uVar2 >> 0x10);
        auVar18._0_2_ = (short)uVar2 * (short)uVar2;
        auVar20._0_10_ = (unkuint10)0;
        auVar21._10_4_ = 0;
        auVar21._0_10_ = auVar20._0_10_;
        auVar21._14_2_ = in_XMM7._6_2_;
        auVar20._12_4_ = auVar21._12_4_;
        auVar20._10_2_ = in_XMM7._4_2_;
        auVar19._10_6_ = auVar20._10_6_;
        auVar19._0_10_ = (unkuint10)0;
        auVar4._4_8_ = auVar19._8_8_;
        auVar4._2_2_ = in_XMM7._2_2_;
        auVar4._0_2_ = sVar3 * sVar3;
        auVar18._2_2_ = in_XMM7._0_2_;
        auVar18._4_12_ = auVar4;
        lVar13 = lVar13 + (auVar18._0_8_ & 0xffffffff);
        lVar14 = lVar14 + (ulong)auVar4._0_4_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = (ulong)CONCAT24((short)((uint)uVar1 >> 0x10),uVar1) & 0xffffffff0000ffff;
        auVar17 = pmaddwd(auVar17,in_XMM6);
        auVar22._0_8_ = auVar17._0_8_;
        auVar22._8_4_ = auVar17._4_4_;
        auVar22._12_4_ = -(uint)(auVar17._4_4_ < 0);
        lVar11 = lVar11 + CONCAT44(-(uint)(auVar17._0_4_ < 0),auVar17._0_4_);
        lVar12 = lVar12 + auVar22._8_8_;
        lVar9 = lVar9 + 2;
      } while (lVar9 != 4);
      lVar15 = lVar16 + lVar15;
      lVar13 = lVar14 + lVar13;
      lVar11 = lVar12 + lVar11;
      lVar8 = lVar8 + 1;
      psVar7 = psVar7 + 1;
      psVar6 = psVar6 + 1;
    } while (lVar8 != lVar5);
  }
  lVar5 = lVar5 * 4;
  dVar10 = (double)(lVar5 * lVar13 - lVar15 * lVar15) * (double)(sum02 * lVar5 - sum0 * sum0);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  return (double)(lVar11 * lVar5 - lVar15 * sum0) / dVar10;
}

Assistant:

TValueCC calcCC(
    const TWaveformViewT<TSampleMI16> & waveform0,
    const TWaveformViewT<TSampleMI16> & waveform1,
    int64_t sum0, int64_t sum02) {
    TValueCC cc = -1.0f;

    int64_t sum1 = 0;
    int64_t sum12 = 0;
    int64_t sum01 = 0;

    auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;
    auto n1       = waveform1.n;

#ifdef MY_DEBUG
    if (n0 != n1) {
        printf("BUG 234f8273\n");
    }
#endif
    auto n = std::min(n0, n1);

    for (int64_t is = 0; is < n; ++is) {
        for (int j = 0; j < TSampleMI16::N; j++) {
            int32_t a0 = samples0[is][j];
            int32_t a1 = samples1[is][j];

            sum1 += a1;
            sum12 += a1*a1;
            sum01 += a0*a1;
        }
    }

    n *= TSampleMI16::N;

    {
        double nom   = sum01*n - sum0*sum1;
        double den2a = sum02*n - sum0*sum0;
        double den2b = sum12*n - sum1*sum1;
        cc = (nom)/(sqrt(den2a*den2b));
    }

    return cc;
}